

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall
QL_Manager::InsertIntoRelation
          (QL_Manager *this,char *relName,int tupleLength,int nValues,Value *values)

{
  RID local_e0;
  RID local_d8;
  RID recRID;
  char *recbuf;
  undefined1 local_c0 [8];
  RM_FileHandle relFH;
  undefined1 local_68 [8];
  Printer printer;
  DataAttrInfo *printAttributes;
  RC rc;
  Value *values_local;
  int nValues_local;
  int tupleLength_local;
  char *relName_local;
  QL_Manager *this_local;
  
  printer._32_8_ = malloc((long)this->relEntries->attrCount * 0x44);
  this_local._4_4_ = SetUpPrinterInsert(this,(DataAttrInfo *)printer._32_8_);
  if (this_local._4_4_ == 0) {
    Printer::Printer((Printer *)local_68,(DataAttrInfo *)printer._32_8_,this->relEntries->attrCount)
    ;
    Printer::PrintHeader((Printer *)local_68,(ostream *)&std::cout);
    RM_FileHandle::RM_FileHandle((RM_FileHandle *)local_c0);
    this_local._4_4_ = RM_Manager::OpenFile(this->rmm,relName,(RM_FileHandle *)local_c0);
    if (this_local._4_4_ == 0) {
      recRID = (RID)malloc((long)tupleLength);
      CreateRecord(this,(char *)recRID,this->attrEntries,nValues,values);
      RID::RID(&local_d8);
      this_local._4_4_ =
           RM_FileHandle::InsertRec((RM_FileHandle *)local_c0,(char *)recRID,&local_d8);
      if (this_local._4_4_ == 0) {
        Printer::Print((Printer *)local_68,(ostream *)&std::cout,(char *)recRID);
        local_e0 = local_d8;
        this_local._4_4_ = InsertIntoIndex(this,(char *)recRID,&local_e0);
        RID::~RID(&local_e0);
        if (this_local._4_4_ == 0) {
          Printer::PrintFooter((Printer *)local_68,(ostream *)&std::cout);
          free((void *)recRID);
          free((void *)printer._32_8_);
          this_local._4_4_ = RM_Manager::CloseFile(this->rmm,(RM_FileHandle *)local_c0);
        }
        else {
          free((void *)recRID);
        }
      }
      else {
        free((void *)recRID);
      }
      RID::~RID(&local_d8);
    }
    RM_FileHandle::~RM_FileHandle((RM_FileHandle *)local_c0);
    Printer::~Printer((Printer *)local_68);
  }
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::InsertIntoRelation(const char *relName, int tupleLength, int nValues, const Value values[]){
  // Open relation
  RC rc = 0;
  
  // Creates the attribute setup for printing
  DataAttrInfo * printAttributes = (DataAttrInfo *)malloc(relEntries->attrCount* sizeof(DataAttrInfo));
  if((rc = SetUpPrinterInsert(printAttributes)))
    return (rc);
  Printer printer(printAttributes, relEntries->attrCount);
  printer.PrintHeader(cout);

  // Open the appropriate file
  RM_FileHandle relFH;
  if((rc = rmm.OpenFile(relName, relFH))){
    return (rc);
  }
  char *recbuf = (char *)malloc(tupleLength);

  // Create record
  CreateRecord(recbuf, attrEntries, nValues, values);

  // Insert into relation
  RID recRID;
  if((rc = relFH.InsertRec(recbuf, recRID))){
    free(recbuf);
    return (rc);
  }
  printer.Print(cout, recbuf);
  // Insert into any indices in the relation
  if((rc = InsertIntoIndex(recbuf, recRID))){
    free(recbuf);
    return (rc);
  }

  printer.PrintFooter(cout);
  free(recbuf);
  free(printAttributes);
  // Close relation, clean up
  rc = rmm.CloseFile(relFH);
  return (rc);

}